

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeGetSensDky(void *cvode_mem,sunrealtype t,int k,N_Vector *dkyS)

{
  long in_RDX;
  CVodeMem in_RDI;
  CVodeMem cv_mem;
  int is;
  int ier;
  undefined4 in_stack_00000018;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = 0;
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0xfe8,"CVodeGetSensDky",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDX == 0) {
    cvProcessError(in_RDI,-0x1a,0xff1,"CVodeGetSensDky",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                   ,"dkyA = NULL illegal.");
    local_4 = -0x1a;
  }
  else {
    local_30 = 0;
    while ((local_30 < in_RDI->cv_Ns &&
           (local_2c = CVodeGetSensDky1((void *)CONCAT44(k,in_stack_00000018),(sunrealtype)dkyS,ier,
                                        is,(N_Vector)cv_mem), local_2c == 0))) {
      local_30 = local_30 + 1;
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

int CVodeGetSensDky(void* cvode_mem, sunrealtype t, int k, N_Vector* dkyS)
{
  int ier = CV_SUCCESS;
  int is;
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  if (dkyS == NULL)
  {
    cvProcessError(cv_mem, CV_BAD_DKY, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_DKYA);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_BAD_DKY);
  }

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    ier = CVodeGetSensDky1(cvode_mem, t, k, is, dkyS[is]);
    if (ier != CV_SUCCESS) { break; }
  }

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (ier);
}